

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O0

void list_genocided(char defquery,boolean ask)

{
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  nh_menuitem *pnVar4;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  menulist menu;
  char buf [256];
  char *title;
  char *query;
  uint local_18;
  uint uStack_14;
  char c;
  int nextincted;
  int ngenocided;
  int i;
  boolean ask_local;
  char defquery_local;
  
  local_18 = 0;
  uStack_14 = 0;
  for (nextincted = 0; nextincted < 0x193; nextincted = nextincted + 1) {
    if ((mvitals[nextincted].mvflags & 2) != 0) {
      uStack_14 = uStack_14 + 1;
    }
    if (((mvitals[nextincted].mvflags & 3) != 0) && ((mons[nextincted].geno & 0x1000) == 0)) {
      local_18 = local_18 + 1;
    }
  }
  if ((uStack_14 != 0) || (local_18 != 0)) {
    pcVar2 = "Do you want a list of species genocided?";
    if (local_18 != 0) {
      pcVar2 = "Do you want a list of species genocided or extinct?";
    }
    if (ask != '\0') {
      defquery = yn_function(pcVar2,"ynq",defquery);
    }
    if (defquery == 'q') {
      program_state.stopprint = program_state.stopprint + 1;
    }
    if (defquery == 'y') {
      init_menulist((menulist *)&_item_);
      for (nextincted = 0; nextincted < 0x193; nextincted = nextincted + 1) {
        if (((mvitals[nextincted].mvflags & 2) != 0) ||
           (((mvitals[nextincted].mvflags & 1) != 0 && ((mons[nextincted].geno & 0x1000) == 0)))) {
          if (((mons[nextincted].geno & 0x1000) == 0) || (nextincted == 0x120)) {
            pcVar2 = mons_mname(mons + nextincted);
            pcVar2 = makeplural(pcVar2);
            strcpy((char *)&menu.size,pcVar2);
          }
          else {
            pcVar2 = "the ";
            if ((mons[nextincted].mflags2 & 0x80000) == 0) {
              pcVar2 = "";
            }
            pcVar3 = mons_mname(mons + nextincted);
            sprintf((char *)&menu.size,"%s%s",pcVar2,pcVar3);
          }
          if ((mvitals[nextincted].mvflags & 2) == 0) {
            strcat((char *)&menu.size," (extinct)");
          }
          if ((int)menu.items <= menu.items._4_4_) {
            menu.items._0_4_ = (int)menu.items << 1;
            _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
          }
          pnVar4 = _item_ + menu.items._4_4_;
          pnVar4->id = 0;
          pnVar4->role = MI_TEXT;
          pnVar4->accel = '\0';
          pnVar4->group_accel = '\0';
          pnVar4->selected = '\0';
          strcpy(pnVar4->caption,(char *)&menu.size);
          menu.items._4_4_ = menu.items._4_4_ + 1;
        }
      }
      if ((0 < (int)local_18) && (bVar1 = aprilfoolsday(), bVar1 != '\0')) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        pnVar4 = _item_ + menu.items._4_4_;
        pnVar4->id = 0;
        pnVar4->role = MI_TEXT;
        pnVar4->accel = '\0';
        pnVar4->group_accel = '\0';
        pnVar4->selected = '\0';
        strcpy(pnVar4->caption,"ammonites (extinct)");
        menu.items._4_4_ = menu.items._4_4_ + 1;
        local_18 = local_18 + 1;
      }
      if ((int)menu.items <= menu.items._4_4_) {
        menu.items._0_4_ = (int)menu.items << 1;
        _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
      }
      pnVar4 = _item_ + menu.items._4_4_;
      pnVar4->id = 0;
      pnVar4->role = MI_TEXT;
      pnVar4->accel = '\0';
      pnVar4->group_accel = '\0';
      pnVar4->selected = '\0';
      strcpy(pnVar4->caption,"");
      menu.items._4_4_ = menu.items._4_4_ + 1;
      sprintf((char *)&menu.size,"%d species genocided.",(ulong)uStack_14);
      if (uStack_14 != 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        pnVar4 = _item_ + menu.items._4_4_;
        pnVar4->id = 0;
        pnVar4->role = MI_TEXT;
        pnVar4->accel = '\0';
        pnVar4->group_accel = '\0';
        pnVar4->selected = '\0';
        strcpy(pnVar4->caption,(char *)&menu.size);
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
      sprintf((char *)&menu.size,"%d species extinct.",(ulong)local_18);
      if (local_18 != 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
        }
        pnVar4 = _item_ + menu.items._4_4_;
        pnVar4->id = 0;
        pnVar4->role = MI_TEXT;
        pnVar4->accel = '\0';
        pnVar4->group_accel = '\0';
        pnVar4->selected = '\0';
        strcpy(pnVar4->caption,(char *)&menu.size);
        menu.items._4_4_ = menu.items._4_4_ + 1;
      }
      pcVar2 = "Genocided species:";
      if (local_18 != 0) {
        pcVar2 = "Genocided or extinct species:";
      }
      display_menu(_item_,menu.items._4_4_,pcVar2,0,(int *)0x0);
      free(_item_);
    }
  }
  return;
}

Assistant:

void list_genocided(char defquery, boolean ask)
{
    int i;
    int ngenocided, nextincted;
    char c, *query, *title;
    char buf[BUFSZ];
    struct menulist menu;

    ngenocided = nextincted = 0;
    for (i = LOW_PM; i < NUMMONS; ++i) {
	if (mvitals[i].mvflags & G_GENOD)
	    ngenocided++;
	if ((mvitals[i].mvflags & G_GONE) && !(mons[i].geno & G_UNIQ))
	    nextincted++;
    }

    /* genocided species list */
    if (ngenocided != 0 || nextincted != 0) {
	query = nextincted ? "Do you want a list of species genocided or extinct?" :
	                     "Do you want a list of species genocided?";
	c = ask ? yn_function(query, ynqchars, defquery) : defquery;
	if (c == 'q') done_stopprint++;
	if (c == 'y') {
	    init_menulist(&menu);
	    for (i = LOW_PM; i < NUMMONS; i++)
		if ((mvitals[i].mvflags & G_GENOD) ||
		    ((mvitals[i].mvflags & G_EXTINCT) && !(mons[i].geno & G_UNIQ))) {
		    if ((mons[i].geno & G_UNIQ) && i != PM_HIGH_PRIEST)
			sprintf(buf, "%s%s",
				!type_is_pname(&mons[i]) ? "" : "the ",
				mons_mname(&mons[i]));
		    else
			strcpy(buf, makeplural(mons_mname(&mons[i])));
		
		    if( !(mvitals[i].mvflags & G_GENOD) )
			strcat(buf, " (extinct)");
		    add_menutext(&menu, buf);
		}

	    if (nextincted > 0 && aprilfoolsday()) {
		add_menutext(&menu, "ammonites (extinct)");
		nextincted++;
	    }

	    add_menutext(&menu, "");
	    sprintf(buf, "%d species genocided.", ngenocided);
	    if (ngenocided)
		add_menutext(&menu, buf);
	    sprintf(buf, "%d species extinct.", nextincted);
	    if (nextincted)
		add_menutext(&menu, buf);

	    title = nextincted ? "Genocided or extinct species:" :
	                         "Genocided species:";
	    display_menu(menu.items, menu.icount, title, PICK_NONE, NULL);
	    free(menu.items);
	}
    }
}